

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repair.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_4::Repairer::ArchiveFile(Repairer *this,string *fname)

{
  Logger *info_log;
  char *pcVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Status local_a0 [4];
  Status local_80;
  Status s;
  string new_file;
  Status local_58 [3];
  string local_40 [8];
  string new_dir;
  char *slash;
  string *fname_local;
  Repairer *this_local;
  
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = strrchr(pcVar1,0x2f);
  std::__cxx11::string::string(local_40);
  if (pcVar1 != (char *)0x0) {
    uVar2 = std::__cxx11::string::data();
    std::__cxx11::string::data();
    std::__cxx11::string::assign((char *)local_40,uVar2);
  }
  std::__cxx11::string::append((char *)local_40);
  (*this->env_->_vptr_Env[9])(local_58,this->env_,local_40);
  Status::~Status(local_58);
  std::__cxx11::string::string((string *)&s,local_40);
  std::__cxx11::string::append((char *)&s);
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::c_str();
  }
  std::__cxx11::string::append((char *)&s);
  (*this->env_->_vptr_Env[0xc])(&local_80,this->env_,fname,&s);
  info_log = (this->options_).info_log;
  uVar3 = std::__cxx11::string::c_str();
  Status::ToString_abi_cxx11_(local_a0);
  uVar4 = std::__cxx11::string::c_str();
  Log(info_log,"Archiving %s: %s\n",uVar3,uVar4);
  std::__cxx11::string::~string((string *)local_a0);
  Status::~Status(&local_80);
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void ArchiveFile(const std::string& fname) {
    // Move into another directory.  E.g., for
    //    dir/foo
    // rename to
    //    dir/lost/foo
    const char* slash = strrchr(fname.c_str(), '/');
    std::string new_dir;
    if (slash != nullptr) {
      new_dir.assign(fname.data(), slash - fname.data());
    }
    new_dir.append("/lost");
    env_->CreateDir(new_dir);  // Ignore error
    std::string new_file = new_dir;
    new_file.append("/");
    new_file.append((slash == nullptr) ? fname.c_str() : slash + 1);
    Status s = env_->RenameFile(fname, new_file);
    Log(options_.info_log, "Archiving %s: %s\n", fname.c_str(),
        s.ToString().c_str());
  }